

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

tokens __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::ScanStringTemplateMiddleOrEnd
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,EncodedCharPtr *pp)

{
  EncodedCharPtr last_00;
  OLECHAR OVar1;
  EncodedCharPtr last;
  OLECHAR ch;
  EncodedCharPtr *pp_local;
  Scanner<UTF8EncodingPolicyBase<false>_> *this_local;
  
  Scanner<UTF8EncodingPolicyBase<false>>::ScanStringConstant<true,true>
            ((Scanner<UTF8EncodingPolicyBase<false>> *)this,L'`',pp);
  last_00 = this->m_pchLast;
  OVar1 = UTF8EncodingPolicyBase<false>::ReadFirst(pp,last_00);
  if (OVar1 == L'`') {
    this->m_fStringTemplateDepth = this->m_fStringTemplateDepth - 1;
    this_local._4_4_ = tkStrTmplEnd;
  }
  else if ((OVar1 == L'$') &&
          (OVar1 = UTF8EncodingPolicyBase<false>::ReadFirst(pp,last_00), OVar1 == L'{')) {
    this_local._4_4_ = tkStrTmplMid;
  }
  else {
    *pp = *pp + -1;
    this_local._4_4_ = ScanError(this,this->m_currentCharacter,tkStrTmplEnd);
  }
  return this_local._4_4_;
}

Assistant:

tokens Scanner<EncodingPolicy>::ScanStringTemplateMiddleOrEnd(EncodedCharPtr *pp)
{
    // String template middle and end tokens must begin with a string constant
    ScanStringConstant<true, true>('`', pp);

    OLECHAR ch;
    EncodedCharPtr last = m_pchLast;

    ch = this->ReadFirst(*pp, last);

    if (ch == '`')
    {
        // No longer in string template scanning mode
        m_fStringTemplateDepth--;

        // This is the last part of the template ...`
        return tkStrTmplEnd;
    }
    else if (ch == '$')
    {
        ch = this->ReadFirst(*pp, last);

        if (ch == '{')
        {
            // This is just another middle part of the template }...${
            return tkStrTmplMid;
        }
    }

    // Error - make sure pointer stays at the last character of the error token instead of after it in the error case
    (*pp)--;
    return ScanError(m_currentCharacter, tkStrTmplEnd);
}